

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

ArenaMemoryData * MemoryProfiler::Begin(LPCWSTR name)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ArenaAllocator *pAVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  TrackAllocData local_b8;
  ArenaMemoryData *local_90;
  ArenaMemoryData *memoryData;
  code *local_80;
  undefined8 local_78;
  TrackAllocData local_70;
  ArenaMemoryData *local_48;
  ArenaMemoryDataSummary *local_40;
  ArenaMemoryDataSummary *arenaTotalMemoryData;
  MemoryProfiler *local_28;
  MemoryProfiler *memoryProfiler;
  ArenaMemoryData *pAStack_18;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  LPCWSTR name_local;
  
  pAStack_18 = (ArenaMemoryData *)name;
  bVar2 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,TraceMemoryFlag);
  if (bVar2) {
    if (pAStack_18 == (ArenaMemoryData *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                         ,0x5f,"(name != nullptr)","name != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    iVar3 = PAL_wcscmp((char16_t *)pAStack_18,L"MemoryProfiler");
    if (iVar3 == 0) {
      name_local = (LPCWSTR)0x0;
    }
    else {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&memoryProfiler + 4),
                 ExceptionType_DisableCheck);
      local_28 = EnsureMemoryProfiler();
      local_48 = pAStack_18;
      bVar2 = JsUtil::
              BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<char16_t*>
                        ((BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)&local_28->arenaDataMap,(char16_t **)&local_48,&local_40);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pAVar5 = &local_28->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_70,(type_info *)&ArenaMemoryDataSummary::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                   ,0x6c);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(&pAVar5->
                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                ,&local_70);
        local_80 = Memory::ArenaAllocator::AllocZero;
        local_78 = 0;
        local_40 = (ArenaMemoryDataSummary *)
                   new<Memory::ArenaAllocator>(0xd8,(ArenaAllocator *)pAVar6,0x3fb100);
        memoryData = pAStack_18;
        JsUtil::
        BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Add(&local_28->arenaDataMap,(char16_t **)&memoryData,&local_40);
      }
      local_40->arenaCount = local_40->arenaCount + 1;
      pAVar5 = &local_28->alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b8,(type_info *)&ArenaMemoryData::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                 ,0x71);
      pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(&pAVar5->
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              ,&local_b8);
      name_local = (LPCWSTR)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar6,0x3fb100);
      if (local_40->data == (ArenaMemoryData *)0x0) {
        local_40->data = (ArenaMemoryData *)name_local;
      }
      else {
        ((ArenaMemoryData *)name_local)->next = local_40->data;
        local_40->data->prev = (ArenaMemoryData *)name_local;
        local_40->data = (ArenaMemoryData *)name_local;
      }
      ((ArenaMemoryData *)name_local)->profiler = local_28;
      local_90 = (ArenaMemoryData *)name_local;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&memoryProfiler + 4));
    }
  }
  else {
    name_local = (LPCWSTR)0x0;
  }
  return (ArenaMemoryData *)name_local;
}

Assistant:

ArenaMemoryData *
MemoryProfiler::Begin(LPCWSTR name)
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::TraceMemoryFlag))
    {
        return nullptr;
    }
    Assert(name != nullptr);
    if (wcscmp(name, _u("MemoryProfiler")) == 0)
    {
        // Don't profile memory profiler itself
        return nullptr;
    }

    // This is debug only code, we don't care if we catch the right exception
    AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
    MemoryProfiler * memoryProfiler = EnsureMemoryProfiler();
    ArenaMemoryDataSummary * arenaTotalMemoryData;
    if (!memoryProfiler->arenaDataMap.TryGetValue((LPWSTR)name, &arenaTotalMemoryData))
    {
        arenaTotalMemoryData = AnewStructZ(&memoryProfiler->alloc, ArenaMemoryDataSummary);
        memoryProfiler->arenaDataMap.Add((LPWSTR)name, arenaTotalMemoryData);
    }
    arenaTotalMemoryData->arenaCount++;

    ArenaMemoryData * memoryData = AnewStructZ(&memoryProfiler->alloc, ArenaMemoryData);
    if (arenaTotalMemoryData->data == nullptr)
    {
        arenaTotalMemoryData->data = memoryData;
    }
    else
    {
        memoryData->next = arenaTotalMemoryData->data;
        arenaTotalMemoryData->data->prev = memoryData;
        arenaTotalMemoryData->data = memoryData;
    }
    memoryData->profiler = memoryProfiler;
    return memoryData;
}